

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeapBlock.cpp
# Opt level: O3

bool __thiscall
Memory::SmallHeapBlockT<SmallAllocationBlockAttributes>::VerifyMark
          (SmallHeapBlockT<SmallAllocationBlockAttributes> *this,void *objectAddress,void *target)

{
  undefined4 *puVar1;
  code *pcVar2;
  bool bVar3;
  BOOLEAN BVar4;
  Recycler *pRVar5;
  undefined8 *in_FS_OFFSET;
  
  pRVar5 = HeapBucket::GetRecycler(this->heapBucket);
  bVar3 = HeapBlockMap64::IsAddressInNewChunk(&pRVar5->heapBlockMap,target);
  if (!bVar3) {
    if (((ulong)target & 0xf) != 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar1 = (undefined4 *)*in_FS_OFFSET;
      *puVar1 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.inl"
                         ,0x24d,"(HeapInfo::IsAlignedAddress(objectAddress))",
                         "HeapInfo::IsAlignedAddress(objectAddress)");
      if (!bVar3) {
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      *puVar1 = 0;
    }
    BVar4 = BVStatic<256UL>::Test(this->markBits,(uint)((ulong)target >> 4) & 0xff);
    if (BVar4 == '\x01') {
      return true;
    }
    HeapBlock::PrintVerifyMarkFailure
              (this->heapBucket->heapInfo->recycler,(char *)objectAddress,(char *)target);
  }
  return false;
}

Assistant:

bool
SmallHeapBlockT<TBlockAttributes>::VerifyMark(void * objectAddress, void * target)
{
    // Because we mark through new object, we might have a false reference
    // somewhere that we have scanned before this new block is allocated
    // so the object will not be marked even though it looks like a reference
    // Can't verify when the block is new
    if (this->heapBucket->GetRecycler()->heapBlockMap.IsAddressInNewChunk(target))
    {
        return false;
    }

    ushort bitIndex = GetAddressBitIndex(target);
    bool isMarked = this->GetMarkedBitVector()->Test(bitIndex) == TRUE;
#if DBG
    if (!isMarked)
    {
        PrintVerifyMarkFailure(this->GetRecycler(), (char*)objectAddress, (char*)target);
    }
#else
    if (!isMarked)
    {
        DebugBreak();
    }
#endif
    return isMarked;
}